

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O1

void __thiscall
xray_re::cse_alife_creature_actor::state_write(cse_alife_creature_actor *this,xr_packet *packet)

{
  cse_alife_creature_abstract::state_write(&this->super_cse_alife_creature_abstract,packet);
  cse_alife_trader_abstract::state_write(&this->super_cse_alife_trader_abstract,packet);
  (*packet->_vptr_xr_packet[4])(packet,&(this->super_cse_ph_skeleton).m_root_bone);
  (*packet->_vptr_xr_packet[10])(packet,(ulong)(this->super_cse_ph_skeleton).m_flags);
  (*packet->_vptr_xr_packet[8])(packet,(ulong)(this->super_cse_ph_skeleton).m_source_id);
  (*packet->_vptr_xr_packet[8])(packet,(ulong)this->m_holder_id);
  return;
}

Assistant:

void cse_alife_creature_actor::state_write(xr_packet& packet)
{
	cse_alife_creature_abstract::state_write(packet);
	cse_alife_trader_abstract::state_write(packet);
	cse_ph_skeleton::state_write(packet);
	packet.w_u16(m_holder_id);
}